

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,_2U>::normalize(ImageT<unsigned_char,_2U> *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  
  uVar1 = (this->super_Image).height;
  uVar2 = (this->super_Image).width;
  for (lVar3 = 0; (ulong)(uVar1 * uVar2) * 2 != lVar3; lVar3 = lVar3 + 2) {
    color<unsigned_char,_2U>::normalize
              ((color<unsigned_char,_2U> *)((long)&this->pixels->field_0 + lVar3));
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }